

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

CType * lj_ctype_getfieldq(CTState *cts,CType *ct,GCstr *name,CTSize *ofs,CTInfo *qual)

{
  short sVar1;
  ushort uVar2;
  CType *pCVar3;
  uint local_cc;
  CType *pCStack_c8;
  CTInfo q;
  CType *cct;
  CType *fct;
  CTInfo *qual_local;
  CTSize *ofs_local;
  GCstr *name_local;
  CType *ct_local;
  CTState *cts_local;
  
  name_local = (GCstr *)ct;
  while( true ) {
    sVar1._0_1_ = name_local->marked;
    sVar1._1_1_ = name_local->gct;
    if (sVar1 == 0) {
      return (CType *)0x0;
    }
    uVar2._0_1_ = name_local->marked;
    uVar2._1_1_ = name_local->gct;
    name_local = (GCstr *)(cts->tab + uVar2);
    if ((GCstr *)((GCRef *)&name_local->hash)->gcptr64 == name) break;
    if (((name_local->nextgc).gcptr64 & 0xf0ff0000) == 0x80030000) {
      local_cc = 0;
      for (pCStack_c8 = cts->tab + ((uint)(name_local->nextgc).gcptr64 & 0xffff);
          pCStack_c8->info >> 0x1c == 8; pCStack_c8 = cts->tab + (pCStack_c8->info & 0xffff)) {
        if ((pCStack_c8->info >> 0x10 & 0xff) == 1) {
          local_cc = pCStack_c8->size | local_cc;
        }
      }
      pCVar3 = lj_ctype_getfieldq(cts,pCStack_c8,name,ofs,qual);
      if (pCVar3 != (CType *)0x0) {
        if (qual != (CTInfo *)0x0) {
          *qual = local_cc | *qual;
        }
        *ofs = *(CTSize *)((long)&(name_local->nextgc).gcptr64 + 4) + *ofs;
        return pCVar3;
      }
    }
  }
  *ofs = *(CTSize *)((long)&(name_local->nextgc).gcptr64 + 4);
  return (CType *)name_local;
}

Assistant:

CType *lj_ctype_getfieldq(CTState *cts, CType *ct, GCstr *name, CTSize *ofs,
			  CTInfo *qual)
{
  while (ct->sib) {
    ct = ctype_get(cts, ct->sib);
    if (gcref(ct->name) == obj2gco(name)) {
      *ofs = ct->size;
      return ct;
    }
    if (ctype_isxattrib(ct->info, CTA_SUBTYPE)) {
      CType *fct, *cct = ctype_child(cts, ct);
      CTInfo q = 0;
      while (ctype_isattrib(cct->info)) {
	if (ctype_attrib(cct->info) == CTA_QUAL) q |= cct->size;
	cct = ctype_child(cts, cct);
      }
      fct = lj_ctype_getfieldq(cts, cct, name, ofs, qual);
      if (fct) {
	if (qual) *qual |= q;
	*ofs += ct->size;
	return fct;
      }
    }
  }
  return NULL;  /* Not found. */
}